

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# source.cpp
# Opt level: O1

void alGenSources(ALsizei n,ALuint *sources)

{
  uint uVar1;
  pointer pSVar2;
  pointer ptr;
  ulong __n;
  ulong uVar3;
  ALsource *pAVar4;
  pointer pSVar5;
  SourceSubList *this;
  char *pcVar6;
  ulong uVar7;
  ContextRef context;
  vector<ALuint> ids;
  unique_lock<std::mutex> srclock;
  ALCcontext *local_70;
  vector<unsigned_int,_al::allocator<unsigned_int,_4UL>_> local_58;
  unique_lock<std::mutex> local_40;
  
  GetContextRef();
  if (local_70 != (ALCcontext *)0x0) {
    if (n < 0) {
      ALCcontext::setError(local_70,0xa003,"Generating %d sources",(ulong)(uint)n);
    }
    if (0 < n) {
      local_40._M_device = &local_70->mSourceLock;
      local_40._M_owns = false;
      std::unique_lock<std::mutex>::lock(&local_40);
      local_40._M_owns = true;
      uVar1 = ((local_70->mDevice).mPtr)->SourcesMax;
      if (uVar1 - local_70->mNumSources < (uint)n) {
        ALCcontext::setError
                  (local_70,0xa005,"Exceeding %u source limit (%u + %d)",(ulong)uVar1,
                   (ulong)local_70->mNumSources,(ulong)(uint)n);
      }
      else {
        __n = (ulong)(uint)n;
        pSVar5 = (local_70->mSourceList).
                 super__Vector_base<SourceSubList,_al::allocator<SourceSubList,_8UL>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pSVar2 = (local_70->mSourceList).
                 super__Vector_base<SourceSubList,_al::allocator<SourceSubList,_8UL>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        if (pSVar5 == pSVar2) {
          uVar3 = 0;
        }
        else {
          uVar3 = 0;
          do {
            uVar7 = pSVar5->FreeMask - (pSVar5->FreeMask >> 1 & 0x5555555555555555);
            uVar7 = (uVar7 >> 2 & 0x3333333333333333) + (uVar7 & 0x3333333333333333);
            uVar3 = uVar3 + (((uVar7 >> 4) + uVar7 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >> 0x38)
            ;
            pSVar5 = pSVar5 + 1;
          } while (pSVar5 != pSVar2);
        }
        for (; uVar3 < __n; uVar3 = uVar3 + 0x40) {
          if (0x1ffffff0 <
              (ulong)((long)(local_70->mSourceList).
                            super__Vector_base<SourceSubList,_al::allocator<SourceSubList,_8UL>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                     (long)(local_70->mSourceList).
                           super__Vector_base<SourceSubList,_al::allocator<SourceSubList,_8UL>_>.
                           _M_impl.super__Vector_impl_data._M_start)) {
LAB_001227fe:
            if (uVar3 < __n) {
              pcVar6 = "s";
              if (n == 1) {
                pcVar6 = "";
              }
              ALCcontext::setError
                        (local_70,0xa005,"Failed to allocate %d source%s",(ulong)(uint)n,pcVar6);
              goto LAB_001228e2;
            }
            break;
          }
          std::vector<SourceSubList,_al::allocator<SourceSubList,_8UL>_>::emplace_back<>
                    (&local_70->mSourceList);
          pSVar5 = (local_70->mSourceList).
                   super__Vector_base<SourceSubList,_al::allocator<SourceSubList,_8UL>_>._M_impl.
                   super__Vector_impl_data._M_finish;
          pSVar5[-1].FreeMask = 0xffffffffffffffff;
          pAVar4 = (ALsource *)al_calloc(8,0x6600);
          pSVar5[-1].Sources = pAVar4;
          if (pAVar4 == (ALsource *)0x0) {
            this = (local_70->mSourceList).
                   super__Vector_base<SourceSubList,_al::allocator<SourceSubList,_8UL>_>._M_impl.
                   super__Vector_impl_data._M_finish + -1;
            (local_70->mSourceList).
            super__Vector_base<SourceSubList,_al::allocator<SourceSubList,_8UL>_>._M_impl.
            super__Vector_impl_data._M_finish = this;
            SourceSubList::~SourceSubList(this);
            goto LAB_001227fe;
          }
        }
        if (n == 1) {
          pAVar4 = anon_unknown.dwarf_55dd6::AllocSource(local_70);
          *sources = pAVar4->id;
        }
        else {
          local_58.super__Vector_base<unsigned_int,_al::allocator<unsigned_int,_4UL>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_58.super__Vector_base<unsigned_int,_al::allocator<unsigned_int,_4UL>_>._M_impl.
          super__Vector_impl_data._M_finish = (uint *)0x0;
          local_58.super__Vector_base<unsigned_int,_al::allocator<unsigned_int,_4UL>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (uint *)0x0;
          std::vector<unsigned_int,_al::allocator<unsigned_int,_4UL>_>::reserve(&local_58,__n);
          do {
            pAVar4 = anon_unknown.dwarf_55dd6::AllocSource(local_70);
            if (local_58.super__Vector_base<unsigned_int,_al::allocator<unsigned_int,_4UL>_>._M_impl
                .super__Vector_impl_data._M_finish ==
                local_58.super__Vector_base<unsigned_int,_al::allocator<unsigned_int,_4UL>_>._M_impl
                .super__Vector_impl_data._M_end_of_storage) {
              std::vector<unsigned_int,al::allocator<unsigned_int,4ul>>::
              _M_realloc_insert<unsigned_int&>
                        ((vector<unsigned_int,al::allocator<unsigned_int,4ul>> *)&local_58,
                         (iterator)
                         local_58.
                         super__Vector_base<unsigned_int,_al::allocator<unsigned_int,_4UL>_>._M_impl
                         .super__Vector_impl_data._M_finish,&pAVar4->id);
            }
            else {
              *local_58.super__Vector_base<unsigned_int,_al::allocator<unsigned_int,_4UL>_>._M_impl.
               super__Vector_impl_data._M_finish = pAVar4->id;
              local_58.super__Vector_base<unsigned_int,_al::allocator<unsigned_int,_4UL>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   local_58.super__Vector_base<unsigned_int,_al::allocator<unsigned_int,_4UL>_>.
                   _M_impl.super__Vector_impl_data._M_finish + 1;
            }
            ptr = local_58.super__Vector_base<unsigned_int,_al::allocator<unsigned_int,_4UL>_>.
                  _M_impl.super__Vector_impl_data._M_start;
            n = n + -1;
          } while (n != 0);
          if ((long)local_58.super__Vector_base<unsigned_int,_al::allocator<unsigned_int,_4UL>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)local_58.super__Vector_base<unsigned_int,_al::allocator<unsigned_int,_4UL>_>.
                    _M_impl.super__Vector_impl_data._M_start != 0) {
            memmove(sources,local_58.
                            super__Vector_base<unsigned_int,_al::allocator<unsigned_int,_4UL>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                    (long)local_58.
                          super__Vector_base<unsigned_int,_al::allocator<unsigned_int,_4UL>_>.
                          _M_impl.super__Vector_impl_data._M_finish -
                    (long)local_58.
                          super__Vector_base<unsigned_int,_al::allocator<unsigned_int,_4UL>_>.
                          _M_impl.super__Vector_impl_data._M_start);
          }
          if (ptr != (pointer)0x0) {
            al_free(ptr);
          }
        }
      }
LAB_001228e2:
      std::unique_lock<std::mutex>::~unique_lock(&local_40);
    }
  }
  if (local_70 != (ALCcontext *)0x0) {
    al::intrusive_ref<ALCcontext>::release(&local_70->super_intrusive_ref<ALCcontext>);
  }
  return;
}

Assistant:

AL_API void AL_APIENTRY alGenSources(ALsizei n, ALuint *sources)
START_API_FUNC
{
    ContextRef context{GetContextRef()};
    if UNLIKELY(!context) return;

    if UNLIKELY(n < 0)
        context->setError(AL_INVALID_VALUE, "Generating %d sources", n);
    if UNLIKELY(n <= 0) return;

    std::unique_lock<std::mutex> srclock{context->mSourceLock};
    ALCdevice *device{context->mDevice.get()};
    if(static_cast<ALuint>(n) > device->SourcesMax-context->mNumSources)
    {
        context->setError(AL_OUT_OF_MEMORY, "Exceeding %u source limit (%u + %d)",
            device->SourcesMax, context->mNumSources, n);
        return;
    }
    if(!EnsureSources(context.get(), static_cast<ALuint>(n)))
    {
        context->setError(AL_OUT_OF_MEMORY, "Failed to allocate %d source%s", n, (n==1)?"":"s");
        return;
    }

    if(n == 1)
    {
        ALsource *source{AllocSource(context.get())};
        sources[0] = source->id;
    }
    else
    {
        al::vector<ALuint> ids;
        ids.reserve(static_cast<ALuint>(n));
        do {
            ALsource *source{AllocSource(context.get())};
            ids.emplace_back(source->id);
        } while(--n);
        std::copy(ids.cbegin(), ids.cend(), sources);
    }
}